

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O2

FILE * ly_in_file(ly_in *in,FILE *f)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  
  if (in == (ly_in *)0x0) {
    pcVar2 = "in";
  }
  else {
    if (in->type == LY_IN_FILE) {
      __stream = (FILE *)(in->method).f;
      if (f == (FILE *)0x0) {
        return (FILE *)__stream;
      }
      in->type = LY_IN_FD;
      iVar1 = fileno(__stream);
      (in->method).fd = iVar1;
      iVar1 = fileno((FILE *)f);
      iVar1 = ly_in_fd(in,iVar1);
      in->type = LY_IN_FILE;
      if (iVar1 != -1) {
        (in->method).f = f;
        return (FILE *)__stream;
      }
      (in->method).f = (FILE *)__stream;
      return (FILE *)0x0;
    }
    pcVar2 = "in->type == LY_IN_FILE";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_in_file");
  return (FILE *)0x0;
}

Assistant:

LIBYANG_API_DEF FILE *
ly_in_file(struct ly_in *in, FILE *f)
{
    FILE *prev_f;

    LY_CHECK_ARG_RET(NULL, in, in->type == LY_IN_FILE, NULL);

    prev_f = in->method.f;

    if (f) {
        /* convert LY_IN_FILE handler into LY_IN_FD to be able to update it via ly_in_fd() */
        in->type = LY_IN_FD;
        in->method.fd = fileno(prev_f);
        if (ly_in_fd(in, fileno(f)) == -1) {
            in->type = LY_IN_FILE;
            in->method.f = prev_f;
            return NULL;
        }

        /* if success, convert the result back */
        in->type = LY_IN_FILE;
        in->method.f = f;
    }

    return prev_f;
}